

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O0

void testSetGetHelpText_ShouldSucceed(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 uVar1;
  bool bVar2;
  Argengine ae;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  iterator in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string local_d8 [39];
  undefined1 local_b1 [33];
  string local_90 [35];
  undefined1 local_6d;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  size_type local_28;
  undefined1 local_20 [24];
  Argengine local_8 [8];
  
  local_6d = 1;
  local_58 = &local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  local_6d = 0;
  local_30 = &local_50;
  local_28 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1095e4);
  __l._M_len = (size_type)in_stack_ffffffffffffff00;
  __l._M_array = in_stack_fffffffffffffef8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),__l,
           in_stack_fffffffffffffee8);
  juzzlin::Argengine::Argengine(local_8,local_20,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffed0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10963e);
  this = &local_50;
  local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_f8 = local_f8 + -1;
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_f8 != this);
  std::allocator<char>::~allocator(&local_59);
  juzzlin::Argengine::helpText_abi_cxx11_();
  uVar1 = std::operator==(in_stack_fffffffffffffec0,
                          (char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  if (!(bool)uVar1) {
    __assert_fail("ae.helpText() == \"Usage: test [OPTIONS]\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x6c,"void testSetGetHelpText_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_90);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)local_f8,(allocator<char> *)CONCAT17(uVar1,in_stack_fffffffffffffef0));
  juzzlin::Argengine::setHelpText(local_8,local_b1 + 1);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  juzzlin::Argengine::helpText_abi_cxx11_();
  bVar2 = std::operator==(__lhs,(char *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8
                                                ));
  if (!bVar2) {
    __assert_fail("ae.helpText() == \"Foo\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/help_test/help_test.cpp"
                  ,0x6e,"void testSetGetHelpText_ShouldSucceed()");
  }
  std::__cxx11::string::~string(local_d8);
  juzzlin::Argengine::~Argengine(local_8);
  return;
}

Assistant:

void testSetGetHelpText_ShouldSucceed()
{
    Argengine ae({ "test" });
    assert(ae.helpText() == "Usage: test [OPTIONS]");
    ae.setHelpText("Foo");
    assert(ae.helpText() == "Foo");
}